

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O3

void __thiscall Liby::PollerSelect::removeChanel(PollerSelect *this,Channel *ch)

{
  __fd_mask *p_Var1;
  byte bVar2;
  ulong uVar3;
  Logger *this_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  double __x;
  
  if (ch != (Channel *)0x0) {
    uVar6 = ch->fd_;
    if (-1 < (int)uVar6) {
      bVar2 = (byte)uVar6 & 0x3f;
      uVar3 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
      uVar4 = uVar6 >> 6;
      p_Var1 = (this->rset_).fds_bits + uVar4;
      *p_Var1 = *p_Var1 & uVar3;
      p_Var1 = (this->wset_).fds_bits + uVar4;
      *p_Var1 = *p_Var1 & uVar3;
      p_Var1 = (this->eset_).fds_bits + uVar4;
      *p_Var1 = *p_Var1 & uVar3;
      this_00 = Logger::getLogger();
      Logger::log(this_00,__x);
      (this->super_Poller).channels_.
      super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = (Channel *)0x0;
      if (uVar6 == this->maxfd_) {
        while (uVar4 = uVar6 - 1, uVar4 != 0) {
          uVar6 = uVar6 + 0x3e;
          if (-1 < (int)uVar4) {
            uVar6 = uVar4;
          }
          iVar5 = (int)uVar6 >> 6;
          uVar3 = 1L << ((byte)uVar4 & 0x3f);
          if (((((ulong)(this->rset_).fds_bits[iVar5] >> ((ulong)uVar4 & 0x3f) & 1) != 0) ||
              (((this->wset_).fds_bits[iVar5] & uVar3) != 0)) ||
             (uVar6 = uVar4, ((this->eset_).fds_bits[iVar5] & uVar3) != 0)) break;
        }
        this->maxfd_ = uVar4;
      }
      return;
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                ,0x30,"virtual void Liby::PollerSelect::removeChanel(Channel *)");
}

Assistant:

void PollerSelect::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    FD_CLR(fd, &rset_);
    FD_CLR(fd, &wset_);
    FD_CLR(fd, &eset_);

    verbose("try to remove fd %d channel %p", fd, ch);

    setChannel(fd, nullptr);

    if (fd == maxfd_) {
        while (--maxfd_) {
            if (FD_ISSET(maxfd_, &rset_) || FD_ISSET(maxfd_, &wset_) ||
                FD_ISSET(maxfd_, &eset_)) {
                break;
            }
        }
    }
}